

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

void readJson(string *filename,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *nonTerminalsV,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *terminalsT,vector<Production_*,_std::allocator<Production_*>_> *productionsP,
             string *startS)

{
  undefined4 uVar1;
  SizeType SVar2;
  Type pGVar3;
  Ch *pCVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar5;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>> *this;
  Production *this_00;
  Production *local_410;
  Production *production;
  undefined1 local_400 [8];
  string inputStr;
  uint local_3d4;
  SizeType i_3;
  Value *replacement_value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  replacement;
  Value *transition;
  undefined1 auStack_398 [4];
  SizeType i_2;
  Type local_388;
  Value *transitions_value;
  undefined1 local_378 [8];
  string s_1;
  undefined1 auStack_350 [4];
  SizeType i_1;
  Type local_340;
  Value *nonterminals_value;
  undefined1 local_330 [8];
  string s;
  undefined1 auStack_308 [4];
  SizeType i;
  Type local_2f8;
  Value *terminals_value;
  Document pda_document;
  undefined1 local_280 [8];
  IStreamWrapper pda_stream_wrapper;
  ifstream pda_stream;
  string *startS_local;
  vector<Production_*,_std::allocator<Production_*>_> *productionsP_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *terminalsT_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *nonTerminalsV_local;
  string *filename_local;
  
  std::ifstream::ifstream(&pda_stream_wrapper.eof_,(string *)filename,_S_in);
  rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::
  BasicIStreamWrapper((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                      local_280,
                      (basic_istream<char,_std::char_traits<char>_> *)&pda_stream_wrapper.eof_);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)&terminals_value,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::ParseStream<rapidjson::BasicIStreamWrapper<std::istream>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)&terminals_value,
             (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)local_280);
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)&terminals_value,"Start");
  pCVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar3);
  std::__cxx11::string::operator=((string *)startS,pCVar4);
  local_2f8 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)&terminals_value,"Terminals");
  std::
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::initializer_list((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)auStack_308);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(terminalsT,_auStack_308);
  s.field_2._12_4_ = 0;
  while( true ) {
    uVar1 = s.field_2._12_4_;
    SVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(local_2f8);
    if (SVar2 <= (uint)uVar1) break;
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](local_2f8,s.field_2._12_4_);
    pCVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pGVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_330,pCVar4,(allocator<char> *)((long)&nonterminals_value + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&nonterminals_value + 7));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)terminalsT,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
    std::__cxx11::string::~string((string *)local_330);
    s.field_2._12_4_ = s.field_2._12_4_ + 1;
  }
  local_340 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)&terminals_value,"Variables");
  std::
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::initializer_list((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)auStack_350);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(nonTerminalsV,_auStack_350);
  s_1.field_2._12_4_ = 0;
  while( true ) {
    uVar1 = s_1.field_2._12_4_;
    SVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(local_340);
    if (SVar2 <= (uint)uVar1) break;
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](local_340,s_1.field_2._12_4_);
    pCVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pGVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_378,pCVar4,(allocator<char> *)((long)&transitions_value + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&transitions_value + 7));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)nonTerminalsV,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378);
    std::__cxx11::string::~string((string *)local_378);
    s_1.field_2._12_4_ = s_1.field_2._12_4_ + 1;
  }
  local_388 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)&terminals_value,"Productions");
  std::initializer_list<Production_*>::initializer_list
            ((initializer_list<Production_*> *)auStack_398);
  std::vector<Production_*,_std::allocator<Production_*>_>::operator=(productionsP,_auStack_398);
  transition._4_4_ = 0;
  while( true ) {
    SVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(local_388);
    if (SVar2 <= transition._4_4_) break;
    this = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::operator[](local_388,transition._4_4_);
    replacement_value = (Value *)0x0;
    replacement.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    replacement.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&replacement_value);
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this,"body");
    local_3d4 = 0;
    while( true ) {
      SVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Size(pGVar3);
      if (SVar2 <= local_3d4) break;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator[](pGVar3,local_3d4);
      inputStr.field_2._8_8_ =
           rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar5);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &replacement_value,(char **)((long)&inputStr.field_2 + 8));
      local_3d4 = local_3d4 + 1;
    }
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this,"head");
    pCVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pGVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_400,pCVar4,(allocator<char> *)((long)&production + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&production + 7));
    this_00 = (Production *)operator_new(0x38);
    Production::Production
              (this_00,(string *)local_400,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&replacement_value);
    local_410 = this_00;
    std::vector<Production_*,_std::allocator<Production_*>_>::push_back(productionsP,&local_410);
    std::__cxx11::string::~string((string *)local_400);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&replacement_value);
    transition._4_4_ = transition._4_4_ + 1;
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)&terminals_value);
  std::ifstream::~ifstream(&pda_stream_wrapper.eof_);
  return;
}

Assistant:

void readJson(std::string filename,
              std::vector<std::string> &nonTerminalsV,
              std::vector<std::string> &terminalsT,
              std::vector<Production *> &productionsP,
              std::string &startS) {

    // Read the file
    std::ifstream pda_stream(filename);
    rapidjson::IStreamWrapper pda_stream_wrapper(pda_stream);
    rapidjson::Document pda_document;
    pda_document.ParseStream(pda_stream_wrapper);

    startS = pda_document["Start"].GetString();

    // Terminals
    rapidjson::Value &terminals_value = pda_document["Terminals"];

    terminalsT = {};

    for (rapidjson::SizeType i = 0; i < terminals_value.Size(); i++) {
        std::string s = terminals_value[i].GetString();
        terminalsT.emplace_back(s);
    }

    // non-Terminals
    rapidjson::Value &nonterminals_value = pda_document["Variables"];

    nonTerminalsV = {};

    for (rapidjson::SizeType i = 0; i < nonterminals_value.Size(); i++) {
        std::string s = nonterminals_value[i].GetString();
        nonTerminalsV.emplace_back(s);
    }


    // Transitions
    rapidjson::Value &transitions_value = pda_document["Productions"];

    productionsP = {};

    for (rapidjson::SizeType i = 0; i < transitions_value.Size(); i++) {

        rapidjson::Value &transition = transitions_value[i];

        std::vector<std::string> replacement = {};
        rapidjson::Value &replacement_value = transition["body"];

        for (rapidjson::SizeType i = 0; i < replacement_value.Size(); i++) {
            replacement.emplace_back(replacement_value[i].GetString());
        }

        std::string inputStr = transition["head"].GetString();

        Production *production = new Production(inputStr, replacement);
        productionsP.push_back(production);
    }

}